

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# selfguided_avx2.c
# Opt level: O0

__m256i * cross_sum_fast_odd_row(int32_t *buf)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  void *in_RSI;
  __m256i *in_RDI;
  undefined8 in_XMM0_Qa;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 in_XMM0_Qb;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 in_YMM0_H;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 in_register_00001218;
  undefined8 uVar11;
  undefined8 uVar12;
  __m256i fives_plus_sixes;
  __m256i sixes;
  __m256i fives;
  __m256i xr;
  __m256i x;
  __m256i xl;
  
  yy_loadu_256((__m256i *)((long)in_RDI[-1] + 0x1c),in_RSI);
  uVar5 = in_XMM0_Qa;
  uVar7 = in_XMM0_Qb;
  uVar9 = in_YMM0_H;
  uVar11 = in_register_00001218;
  yy_loadu_256(in_RDI,in_RSI);
  uVar6 = uVar5;
  uVar8 = uVar7;
  uVar10 = uVar9;
  uVar12 = uVar11;
  yy_loadu_256((__m256i *)((long)*in_RDI + 4),in_RSI);
  auVar4._8_8_ = in_XMM0_Qb;
  auVar4._0_8_ = in_XMM0_Qa;
  auVar4._16_8_ = in_YMM0_H;
  auVar4._24_8_ = in_register_00001218;
  auVar1._8_8_ = uVar8;
  auVar1._0_8_ = uVar6;
  auVar1._16_8_ = uVar10;
  auVar1._24_8_ = uVar12;
  auVar1 = vpaddd_avx2(auVar4,auVar1);
  auVar3._8_8_ = uVar7;
  auVar3._0_8_ = uVar5;
  auVar3._16_8_ = uVar9;
  auVar3._24_8_ = uVar11;
  auVar1 = vpaddd_avx2(auVar1,auVar3);
  auVar2 = vpslld_avx2(auVar1,ZEXT416(2));
  auVar1 = vpaddd_avx2(auVar2,auVar1);
  auVar2._8_8_ = uVar7;
  auVar2._0_8_ = uVar5;
  auVar2._16_8_ = uVar9;
  auVar2._24_8_ = uVar11;
  vpaddd_avx2(auVar1,auVar2);
  return (__m256i *)0x2;
}

Assistant:

static inline __m256i cross_sum_fast_odd_row(const int32_t *buf) {
  const __m256i xl = yy_loadu_256(buf - 1);
  const __m256i x = yy_loadu_256(buf);
  const __m256i xr = yy_loadu_256(buf + 1);

  const __m256i fives = _mm256_add_epi32(xl, xr);
  const __m256i sixes = x;

  const __m256i fives_plus_sixes = _mm256_add_epi32(fives, sixes);

  return _mm256_add_epi32(
      _mm256_add_epi32(_mm256_slli_epi32(fives_plus_sixes, 2),
                       fives_plus_sixes),
      sixes);
}